

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_function.hpp
# Opt level: O2

void asio::detail::executor_function::
     complete<asio::detail::binder1<std::_Bind<void(nuraft::asio_service_impl::*(nuraft::asio_service_impl*,std::_Placeholder<1>))(std::error_code)>,std::error_code>,std::allocator<void>>
               (impl_base *base,bool call)

{
  allocator<void> allocator;
  ptr p;
  allocator<void> local_51;
  ptr local_50;
  undefined1 local_38 [16];
  _Head_base<0UL,_nuraft::asio_service_impl_*,_false> local_28;
  _func_void_impl_base_ptr_bool *local_20;
  error_category *peStack_18;
  
  local_50.a = &local_51;
  local_38._0_8_ = base[1].complete_;
  local_38._8_8_ = base[2].complete_;
  local_28._M_head_impl = (asio_service_impl *)base[3].complete_;
  local_20 = base[4].complete_;
  peStack_18 = (error_category *)base[5].complete_;
  local_50.v = base;
  local_50.p = (impl<asio::detail::binder1<std::_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>,_std::error_code>,_std::allocator<void>_>
                *)base;
  impl<asio::detail::binder1<std::_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>,_std::error_code>,_std::allocator<void>_>
  ::ptr::reset(&local_50);
  if (call) {
    binder1<std::_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>,_std::error_code>
    ::operator()((binder1<std::_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>,_std::error_code>
                  *)local_38);
  }
  impl<asio::detail::binder1<std::_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>,_std::error_code>,_std::allocator<void>_>
  ::ptr::~ptr(&local_50);
  return;
}

Assistant:

static void complete(impl_base* base, bool call)
  {
    // Take ownership of the function object.
    impl<Function, Alloc>* i(static_cast<impl<Function, Alloc>*>(base));
    Alloc allocator(i->allocator_);
    typename impl<Function, Alloc>::ptr p = {
      detail::addressof(allocator), i, i };

    // Make a copy of the function so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the function may be the true owner of the memory
    // associated with the function. Consequently, a local copy of the function
    // is required to ensure that any owning sub-object remains valid until
    // after we have deallocated the memory here.
    Function function(ASIO_MOVE_CAST(Function)(i->function_));
    p.reset();

    // Make the upcall if required.
    if (call)
    {
      asio_handler_invoke_helpers::invoke(function, function);
    }
  }